

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_sqsub_vec(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec t,TCGv_vec sat,TCGv_vec a,
                  TCGv_vec b)

{
  TCGv_vec r;
  TCGv_vec x;
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec sat_local;
  TCGv_vec t_local;
  uint vece_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  r = tcg_temp_new_vec_matching_aarch64(tcg_ctx,t);
  tcg_gen_sub_vec_aarch64(tcg_ctx,vece,r,a,b);
  tcg_gen_sssub_vec_aarch64(tcg_ctx,vece,t,a,b);
  tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_NE,vece,r,r,t);
  tcg_gen_or_vec_aarch64(tcg_ctx,vece,sat,sat,r);
  tcg_temp_free_vec(tcg_ctx,r);
  return;
}

Assistant:

static void gen_sqsub_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec t, TCGv_vec sat,
                          TCGv_vec a, TCGv_vec b)
{
    TCGv_vec x = tcg_temp_new_vec_matching(tcg_ctx, t);
    tcg_gen_sub_vec(tcg_ctx, vece, x, a, b);
    tcg_gen_sssub_vec(tcg_ctx, vece, t, a, b);
    tcg_gen_cmp_vec(tcg_ctx, TCG_COND_NE, vece, x, x, t);
    tcg_gen_or_vec(tcg_ctx, vece, sat, sat, x);
    tcg_temp_free_vec(tcg_ctx, x);
}